

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_task.hpp
# Opt level: O3

void __thiscall tf::AsyncTask::_decref(AsyncTask *this)

{
  long *plVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Node *pNVar3;
  Semaphores *__ptr;
  undefined1 *__ptr_00;
  pointer pcVar4;
  handle_t *phVar5;
  
  pNVar3 = this->_node;
  if (pNVar3 != (Node *)0x0) {
    phVar5 = (handle_t *)0x0;
    if (*(__index_type *)
         ((long)&(pNVar3->_handle).
                 super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
         + 0x38) == '\b') {
      phVar5 = &pNVar3->_handle;
    }
    LOCK();
    plVar1 = (long *)((long)&(phVar5->
                             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                             ).
                             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                             .
                             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                             .
                             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                             .
                             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                             .
                             super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                             ._M_u + 0x28);
    *plVar1 = *plVar1 + -1;
    UNLOCK();
    if (*plVar1 == 0) {
      pNVar3 = this->_node;
      if (pNVar3 != (Node *)0x0) {
        if ((pNVar3->_exception_ptr)._M_exception_object != (void *)0x0) {
          std::__exception_ptr::exception_ptr::_M_release();
        }
        __ptr = (pNVar3->_semaphores)._M_t.
                super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>
                ._M_t.
                super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>
                .super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl;
        if (__ptr != (Semaphores *)0x0) {
          std::default_delete<tf::Node::Semaphores>::operator()
                    ((default_delete<tf::Node::Semaphores> *)&pNVar3->_semaphores,__ptr);
        }
        (pNVar3->_semaphores)._M_t.
        super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>._M_t
        .super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
        super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl = (Semaphores *)0x0;
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                             *)&pNVar3->_handle);
        __ptr_00 = (undefined1 *)
                   (pNVar3->_edges).super_SmallVectorImpl<tf::Node_*>.
                   super_SmallVectorTemplateBase<tf::Node_*,_true>.
                   super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
        if ((U *)__ptr_00 !=
            &(pNVar3->_edges).super_SmallVectorImpl<tf::Node_*>.
             super_SmallVectorTemplateBase<tf::Node_*,_true>.
             super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl) {
          free(__ptr_00);
        }
        pcVar4 = (pNVar3->_name)._M_dataplus._M_p;
        paVar2 = &(pNVar3->_name).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 != paVar2) {
          operator_delete(pcVar4,paVar2->_M_allocated_capacity + 1);
        }
      }
      operator_delete(pNVar3,0xd8);
      return;
    }
  }
  return;
}

Assistant:

inline void AsyncTask::_decref() {
  if(_node && std::get_if<Node::DependentAsync>(&(_node->_handle))->use_count.fetch_sub(
      1, std::memory_order_acq_rel
    ) == 1) {
    recycle(_node);
  }
}